

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall
mp::internal::BinaryReaderBase::ReportError
          (BinaryReaderBase *this,CStringRef format_str,ArgList *args)

{
  BasicWriter<char> *this_00;
  char *s;
  undefined8 *in_RDX;
  int in_ESI;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RDI;
  size_t offset;
  MemoryWriter w;
  allocator<char> *in_stack_fffffffffffffd58;
  BinaryReadError *this_01;
  CStringRef in_stack_fffffffffffffd70;
  unsigned_long *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  BasicWriter<char> *in_stack_fffffffffffffd88;
  BasicCStringRef<char> in_stack_fffffffffffffd90;
  BasicCStringRef<char> local_268;
  long local_260;
  BinaryReadError local_241 [8];
  undefined8 *local_18;
  int local_8;
  
  this_01 = local_241;
  local_18 = in_RDX;
  local_8 = in_ESI;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_RDI,in_stack_fffffffffffffd58);
  std::allocator<char>::~allocator((allocator<char> *)local_241);
  local_260 = *(long *)&(in_RDI->buffer_).field_0x8 -
              (long)(in_RDI->super_BasicWriter<char>).buffer_;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_268,"{}:offset {}: ");
  fmt::BasicWriter<char>::write<std::__cxx11::string,unsigned_long>
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd90,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  fmt::BasicWriter<char>::write
            ((BasicWriter<char> *)&local_241[0].super_Error.super_RuntimeError.field_0x1,local_8,
             (void *)*local_18,local_18[1]);
  this_00 = (BasicWriter<char> *)__cxa_allocate_exception(0x40);
  s = fmt::BasicWriter<char>::c_str(this_00);
  fmt::BasicCStringRef<char>::BasicCStringRef((BasicCStringRef<char> *)&stack0xfffffffffffffd70,s);
  BinaryReadError::BinaryReadError(this_01,(string *)in_RDI,(size_t)s,in_stack_fffffffffffffd70);
  __cxa_throw(this_00,&BinaryReadError::typeinfo,BinaryReadError::~BinaryReadError);
}

Assistant:

void mp::internal::BinaryReaderBase::ReportError(
    fmt::CStringRef format_str, const fmt::ArgList &args) {
  fmt::MemoryWriter w;
  std::size_t offset = token_ - start_;
  w.write("{}:offset {}: ", name_, offset);
  w.write(format_str, args);
  throw BinaryReadError(name_, offset, w.c_str());
}